

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

callback<void_()> * __thiscall
booster::callback<void()>::operator=(callback<void()> *this,intrusive_ptr<mycall> *c)

{
  mycall *pmVar1;
  callable<void_()> *tmp;
  intrusive_ptr<booster::callable<void_()>_> local_28;
  intrusive_ptr<booster::callable<void_()>_> local_20;
  
  pmVar1 = c->p_;
  if (pmVar1 != (mycall *)0x0) {
    booster::atomic_counter::inc();
  }
  local_28.p_ = (callable<void_()> *)0x0;
  local_20.p_ = *(callable<void_()> **)this;
  *(mycall **)this = pmVar1;
  intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_20);
  intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_28);
  return (callback<void_()> *)this;
}

Assistant:

callback const &operator=(intrusive_ptr<Call> c)		
		{ call_ptr = c; return *this; }